

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::FindCMakeResources(char *argv0)

{
  bool bVar1;
  string_view str;
  string exe_dir;
  string src_dir;
  string dir;
  string exe;
  string src_dir_txt;
  string errorMsg;
  string prefix;
  byte abStack_400 [488];
  ifstream fin2;
  byte abStack_1f8 [488];
  
  exe_dir._M_dataplus._M_p = (pointer)&exe_dir.field_2;
  exe_dir._M_string_length = 0;
  errorMsg._M_dataplus._M_p = (pointer)&errorMsg.field_2;
  errorMsg._M_string_length = 0;
  exe_dir.field_2._M_local_buf[0] = '\0';
  errorMsg.field_2._M_local_buf[0] = '\0';
  exe._M_dataplus._M_p = (pointer)&exe.field_2;
  exe._M_string_length = 0;
  exe.field_2._M_local_buf[0] = '\0';
  bVar1 = cmsys::SystemTools::FindProgramPath(argv0,&exe,&errorMsg);
  if (bVar1) {
    cmsys::SystemTools::GetRealPath(&prefix,&exe,(string *)0x0);
    std::__cxx11::string::operator=((string *)&exe,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    cmsys::SystemTools::GetFilenamePath(&prefix,&exe);
    std::__cxx11::string::operator=((string *)&exe_dir,(string *)&prefix);
    std::__cxx11::string::~string((string *)&prefix);
  }
  cmsys::SystemTools::GetActualCaseForPath(&prefix,&exe_dir);
  std::__cxx11::string::operator=((string *)&exe_dir,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  _fin2 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[7],char_const*>
            (&prefix,&exe_dir,(char (*) [7])0x22004a,(char **)&fin2);
  std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,(string *)&prefix)
  ;
  std::__cxx11::string::~string((string *)&prefix);
  _fin2 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[7],char_const*>
            (&prefix,&exe_dir,(char (*) [7])"/ctest",(char **)&fin2);
  std::__cxx11::string::operator=((string *)&cmSystemToolsCTestCommand_abi_cxx11_,(string *)&prefix)
  ;
  std::__cxx11::string::~string((string *)&prefix);
  _fin2 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[7],char_const*>
            (&prefix,&exe_dir,(char (*) [7])"/cpack",(char **)&fin2);
  std::__cxx11::string::operator=((string *)&cmSystemToolsCPackCommand_abi_cxx11_,(string *)&prefix)
  ;
  std::__cxx11::string::~string((string *)&prefix);
  _fin2 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[11],char_const*>
            (&prefix,&exe_dir,(char (*) [11])"/cmake-gui",(char **)&fin2);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMakeGUICommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeGUICommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  _fin2 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[8],char_const*>
            (&prefix,&exe_dir,(char (*) [8])"/ccmake",(char **)&fin2);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMakeCursesCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  _fin2 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<std::__cxx11::string&,char_const(&)[10],char_const*>
            (&prefix,&exe_dir,(char (*) [10])"/cmcldeps",(char **)&fin2);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,(string *)&prefix);
  std::__cxx11::string::~string((string *)&prefix);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar1) {
    cmSystemToolsCMClDepsCommand_abi_cxx11_._M_string_length = 0;
    *cmSystemToolsCMClDepsCommand_abi_cxx11_._M_dataplus._M_p = '\0';
  }
  str._M_str = exe_dir._M_dataplus._M_p;
  str._M_len = exe_dir._M_string_length;
  bVar1 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])"/bin");
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&exe_dir);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[18]>
              ((string *)&fin2,&prefix,(char (*) [18])"/share/cmake-3.29");
    std::__cxx11::string::operator=((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[32]>
              ((string *)&fin2,&prefix,(char (*) [32])"/doc/cmake-3.29/html/index.html");
    bVar1 = cmsys::SystemTools::FileExists((string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    if (bVar1) {
      cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
                ((string *)&fin2,&prefix,(char (*) [21])"/doc/cmake-3.29/html");
      std::__cxx11::string::operator=((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&fin2);
      std::__cxx11::string::~string((string *)&fin2);
    }
    std::__cxx11::string::~string((string *)&prefix);
  }
  if (cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) {
    cmStrCat<std::__cxx11::string&,char_const(&)[21]>
              (&prefix,&cmSystemToolsCMakeRoot_abi_cxx11_,(char (*) [21])"/Modules/CMake.cmake");
    bVar1 = cmsys::SystemTools::FileExists(&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    if (bVar1) goto LAB_001161a1;
  }
  cmsys::SystemTools::GetFilenamePath(&dir,&exe_dir);
  cmStrCat<std::__cxx11::string&,char_const(&)[31]>
            (&src_dir_txt,&dir,(char (*) [31])"/CMakeFiles/CMakeSourceDir.txt");
  std::ifstream::ifstream(&prefix,src_dir_txt._M_dataplus._M_p,_S_in);
  src_dir._M_dataplus._M_p = (pointer)&src_dir.field_2;
  src_dir._M_string_length = 0;
  src_dir.field_2._M_local_buf[0] = '\0';
  if ((abStack_400[*(long *)(prefix._M_dataplus._M_p + -0x18)] & 5) == 0) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&prefix,&src_dir,(bool *)0x0,0xffffffffffffffff);
    if (!bVar1) goto LAB_00116012;
    bVar1 = cmsys::SystemTools::FileIsDirectory(&src_dir);
    if (!bVar1) goto LAB_00116012;
    std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
  }
  else {
LAB_00116012:
    cmsys::SystemTools::GetFilenamePath((string *)&fin2,&dir);
    std::__cxx11::string::operator=((string *)&dir,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    cmStrCat<std::__cxx11::string&,char_const(&)[31]>
              ((string *)&fin2,&dir,(char (*) [31])"/CMakeFiles/CMakeSourceDir.txt");
    std::__cxx11::string::operator=((string *)&src_dir_txt,(string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    std::ifstream::ifstream(&fin2,src_dir_txt._M_dataplus._M_p,_S_in);
    if ((abStack_1f8[*(long *)(_fin2 + -0x18)] & 5) == 0) {
      bVar1 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&fin2,&src_dir,(bool *)0x0,0xffffffffffffffff);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::FileIsDirectory(&src_dir);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&cmSystemToolsCMakeRoot_abi_cxx11_);
        }
      }
    }
    std::ifstream::~ifstream(&fin2);
  }
  if ((cmSystemToolsCMakeRoot_abi_cxx11_._M_string_length != 0) &&
     (cmSystemToolsHTMLDoc_abi_cxx11_._M_string_length == 0)) {
    cmStrCat<std::__cxx11::string&,char_const(&)[34]>
              ((string *)&fin2,&dir,(char (*) [34])"/Utilities/Sphinx/html/index.html");
    bVar1 = cmsys::SystemTools::FileExists((string *)&fin2);
    std::__cxx11::string::~string((string *)&fin2);
    if (bVar1) {
      cmStrCat<std::__cxx11::string&,char_const(&)[23]>
                ((string *)&fin2,&dir,(char (*) [23])"/Utilities/Sphinx/html");
      std::__cxx11::string::operator=((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&fin2);
      std::__cxx11::string::~string((string *)&fin2);
    }
  }
  std::__cxx11::string::~string((string *)&src_dir);
  std::ifstream::~ifstream(&prefix);
  std::__cxx11::string::~string((string *)&src_dir_txt);
  std::__cxx11::string::~string((string *)&dir);
LAB_001161a1:
  std::__cxx11::string::~string((string *)&exe);
  std::__cxx11::string::~string((string *)&errorMsg);
  std::__cxx11::string::~string((string *)&exe_dir);
  return;
}

Assistant:

void cmSystemTools::ExpandRegistryValues(std::string& source,
                                         KeyWOW64 /*unused*/)
{
  cmsys::RegularExpression regEntry("\\[(HKEY[^]]*)\\]");
  while (regEntry.find(source)) {
    // the arguments are the second match
    std::string key = regEntry.match(1);
    std::string reg = cmStrCat('[', key, ']');
    cmSystemTools::ReplaceString(source, reg.c_str(), "/registry");
  }
}